

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t pmxevcntr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  uint64_t uVar1;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = pmevcntr_read(env,ri,(byte)(env->cp15).c9_pmselr & 0x1f);
  return uVar1;
}

Assistant:

static uint64_t pmxevcntr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    return pmevcntr_read(env, ri, env->cp15.c9_pmselr & 31);
}